

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O2

void __thiscall TinyProcessLib::Process::close_fds(Process *this)

{
  int *piVar1;
  
  if ((this->stdout_stderr_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl != (int *)0x0) {
    close_stdin(this);
  }
  piVar1 = (this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (piVar1 != (int *)0x0) {
    if (0 < (this->data).id) {
      close(*piVar1);
    }
    std::__uniq_ptr_impl<int,_std::default_delete<int>_>::reset
              ((__uniq_ptr_impl<int,_std::default_delete<int>_> *)&this->stdout_fd,(pointer)0x0);
  }
  piVar1 = (this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (piVar1 != (int *)0x0) {
    if (0 < (this->data).id) {
      close(*piVar1);
    }
    std::__uniq_ptr_impl<int,_std::default_delete<int>_>::reset
              ((__uniq_ptr_impl<int,_std::default_delete<int>_> *)&this->stderr_fd,(pointer)0x0);
    return;
  }
  return;
}

Assistant:

void Process::close_fds() noexcept {
  if(stdout_stderr_thread.joinable())
    stdout_stderr_thread.join();

  if(stdin_fd)
    close_stdin();
  if(stdout_fd) {
    if(data.id > 0)
      close(*stdout_fd);
    stdout_fd.reset();
  }
  if(stderr_fd) {
    if(data.id > 0)
      close(*stderr_fd);
    stderr_fd.reset();
  }
}